

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O3

Int __thiscall ipx::LpSolver::Solve(LpSolver *this)

{
  int iVar1;
  Basis *this_00;
  bool bVar2;
  int iVar3;
  ostream *os;
  int iVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  double dVar7;
  stringstream h_logging_stream;
  string local_210;
  string local_1f0;
  string local_1d0 [13];
  
  if ((this->model_).num_cols_ == 0) {
    (this->info_).super_ipx_info.status = 0x3ee;
    return 0x3ee;
  }
  ClearSolution(this);
  Control::ResetTimer(&this->control_);
  Control::OpenLogfile(&this->control_);
  local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"IPX version 1.0\n","");
  Control::hLog(&this->control_,local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0[0]._M_dataplus._M_p != &local_1d0[0].field_2) {
    operator_delete(local_1d0[0]._M_dataplus._M_p);
  }
  InteriorPointSolve(this);
  iVar3 = (this->control_).parameters_.super_ipx_parameters.run_crossover;
  iVar4 = (this->info_).super_ipx_info.status_ipm;
  if (iVar4 == 1 && iVar3 == 1) {
LAB_003a1a96:
    paVar6 = &local_1f0.field_2;
    local_1f0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"Running crossover as requested\n","");
    Control::hLog(&this->control_,&local_1f0);
    _Var5._M_p = local_1f0._M_dataplus._M_p;
LAB_003a1aca:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar6) {
      operator_delete(_Var5._M_p);
    }
  }
  else {
    bVar2 = false;
    if ((iVar4 != 2) || ((iVar3 + 1U & 0xfffffffd) != 0)) goto LAB_003a1ae7;
    if (iVar3 == 1) goto LAB_003a1a96;
    if (iVar3 == -1) {
      paVar6 = &local_210.field_2;
      local_210._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,"Running crossover since IPX is imprecise\n","");
      Control::hLog(&this->control_,&local_210);
      _Var5._M_p = local_210._M_dataplus._M_p;
      goto LAB_003a1aca;
    }
  }
  BuildCrossoverStartingPoint(this);
  bVar2 = true;
  RunCrossover(this);
LAB_003a1ae7:
  this_00 = (this->basis_)._M_t.super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>.
            _M_t.super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
            super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl;
  if (this_00 != (Basis *)0x0) {
    dVar7 = Basis::frac_ftran_sparse(this_00);
    (this->info_).super_ipx_info.ftran_sparse = dVar7;
    dVar7 = Basis::frac_btran_sparse
                      ((this->basis_)._M_t.
                       super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t.
                       super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
                       super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl);
    (this->info_).super_ipx_info.btran_sparse = dVar7;
    dVar7 = Basis::time_factorize
                      ((this->basis_)._M_t.
                       super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t.
                       super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
                       super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl);
    (this->info_).super_ipx_info.time_lu_invert = dVar7;
    dVar7 = Basis::time_update((this->basis_)._M_t.
                               super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>
                               .super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl);
    (this->info_).super_ipx_info.time_lu_update = dVar7;
    dVar7 = Basis::time_ftran((this->basis_)._M_t.
                              super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>
                              .super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl);
    (this->info_).super_ipx_info.time_ftran = dVar7;
    dVar7 = Basis::time_btran((this->basis_)._M_t.
                              super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>
                              .super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl);
    (this->info_).super_ipx_info.time_btran = dVar7;
    dVar7 = Basis::mean_fill((this->basis_)._M_t.
                             super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
                             super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl);
    (this->info_).super_ipx_info.mean_fill = dVar7;
    dVar7 = Basis::max_fill((this->basis_)._M_t.
                            super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t
                            .super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
                            super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl);
    (this->info_).super_ipx_info.max_fill = dVar7;
  }
  iVar3 = (this->info_).super_ipx_info.status_ipm;
  iVar4 = 1000;
  if ((1 < iVar3 - 3U) && (iVar1 = (this->info_).super_ipx_info.status_crossover, 1 < iVar1 - 3U)) {
    if (bVar2) {
      iVar3 = iVar1;
    }
    iVar4 = (uint)(1 < iVar3 - 1U) * 5 + 1000;
  }
  (this->info_).super_ipx_info.status = iVar4;
  PrintSummary(this);
  dVar7 = Control::Elapsed(&this->control_);
  (this->info_).super_ipx_info.time_total = dVar7;
  os = Control::Debug(&this->control_,2);
  operator<<(os,&this->info_);
  Control::CloseLogfile(&this->control_);
  if ((this->control_).parameters_.super_ipx_parameters.analyse_basis_data == true) {
    Basis::reportBasisData
              ((this->basis_)._M_t.
               super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t.
               super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
               super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl);
  }
  return (this->info_).super_ipx_info.status;
}

Assistant:

Int LpSolver::Solve() {
    if (model_.empty())
        return info_.status = IPX_STATUS_no_model;
    ClearSolution();
    control_.ResetTimer();
    control_.OpenLogfile();
    control_.hLog("IPX version 1.0\n");
    try {
        InteriorPointSolve();
	const bool run_crossover_on = control_.run_crossover() == 1;
	const bool run_crossover_choose = control_.run_crossover() == -1;
	const bool run_crossover_not_off = run_crossover_choose || run_crossover_on;
	const bool run_crossover =
	  (info_.status_ipm == IPX_STATUS_optimal && run_crossover_on) ||
	  (info_.status_ipm == IPX_STATUS_imprecise && run_crossover_not_off);
	//        if ((info_.status_ipm == IPX_STATUS_optimal ||
	//             info_.status_ipm == IPX_STATUS_imprecise) && run_crossover_on) {
	if (run_crossover) {
	    if (run_crossover_on) {
	      control_.hLog("Running crossover as requested\n");
	    } else if (run_crossover_choose) {
	      assert(info_.status_ipm == IPX_STATUS_imprecise);
	      control_.hLog("Running crossover since IPX is imprecise\n");
	    } else {
	      assert(run_crossover_on || run_crossover_choose);
	    }
	    BuildCrossoverStartingPoint();
            RunCrossover();
        }
        if (basis_) {
            info_.ftran_sparse = basis_->frac_ftran_sparse();
            info_.btran_sparse = basis_->frac_btran_sparse();
            info_.time_lu_invert = basis_->time_factorize();
            info_.time_lu_update = basis_->time_update();
            info_.time_ftran = basis_->time_ftran();
            info_.time_btran = basis_->time_btran();
            info_.mean_fill = basis_->mean_fill();
            info_.max_fill = basis_->max_fill();
        }
        if (info_.status_ipm == IPX_STATUS_primal_infeas ||
            info_.status_ipm == IPX_STATUS_dual_infeas ||
            info_.status_crossover == IPX_STATUS_primal_infeas ||
            info_.status_crossover == IPX_STATUS_dual_infeas) {
            // When IPM or crossover detect the model to be infeasible
            // (currently only the former is implemented), then the problem is
            // solved.
            info_.status = IPX_STATUS_solved;
        } else {
            Int method_status = run_crossover ?
                info_.status_crossover : info_.status_ipm;
            if (method_status == IPX_STATUS_optimal ||
                method_status == IPX_STATUS_imprecise)
                info_.status = IPX_STATUS_solved;
            else
                info_.status = IPX_STATUS_stopped;
        }
        PrintSummary();
    }
    catch (const std::bad_alloc&) {
      control_.hLog(" out of memory\n");
        info_.status = IPX_STATUS_out_of_memory;
    }
    catch (const std::exception& e) {
      std::stringstream h_logging_stream;
      h_logging_stream.str(std::string());
      h_logging_stream << " internal error: " << e.what() << '\n';
      control_.hLog(h_logging_stream);
      info_.status = IPX_STATUS_internal_error;
    }
    info_.time_total = control_.Elapsed();
    control_.Debug(2) << info_;
    control_.CloseLogfile();
    if (control_.reportBasisData())
      basis_->reportBasisData();
    return info_.status;
}